

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disci_intersector.h
# Opt level: O3

void embree::avx2::OrientedDiscMiMBIntersectorK<8,_4,_true>::intersect
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *Disc)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  byte bVar6;
  Scene *pSVar7;
  Geometry *pGVar8;
  long lVar9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  uint uVar35;
  uint uVar36;
  int iVar37;
  ulong uVar38;
  ulong uVar39;
  long lVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  long lVar46;
  ulong uVar47;
  undefined4 uVar48;
  undefined4 uVar53;
  undefined4 uVar54;
  undefined4 uVar55;
  undefined4 uVar56;
  undefined4 uVar57;
  undefined4 uVar58;
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined4 uVar59;
  undefined1 auVar52 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [64];
  undefined1 auVar82 [32];
  undefined1 auVar83 [64];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [64];
  undefined1 auVar87 [32];
  undefined1 auVar88 [64];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [64];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  undefined1 local_330 [16];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  RayHitK<4> *local_2e0;
  size_t local_2d8;
  RTCFilterFunctionNArguments local_2d0;
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  RTCHitN local_210 [16];
  undefined1 local_200 [16];
  undefined1 local_1f0 [16];
  undefined4 local_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  undefined4 local_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  uint local_1c0;
  uint uStack_1bc;
  uint uStack_1b8;
  uint uStack_1b4;
  uint local_1b0;
  uint uStack_1ac;
  uint uStack_1a8;
  uint uStack_1a4;
  uint local_1a0;
  uint uStack_19c;
  uint uStack_198;
  uint uStack_194;
  uint uStack_190;
  uint uStack_18c;
  uint uStack_188;
  uint uStack_184;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  float local_a0;
  float fStack_9c;
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  uint local_80 [4];
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  undefined1 auVar77 [64];
  
  pSVar7 = context->scene;
  local_80[0] = Disc->sharedGeomID;
  pGVar8 = (pSVar7->geometries).items[local_80[0]].ptr;
  fVar1 = (pGVar8->time_range).lower;
  fVar18 = pGVar8->fnumTimeSegments *
           ((*(float *)(ray + k * 4 + 0x70) - fVar1) / ((pGVar8->time_range).upper - fVar1));
  auVar84 = vroundss_avx(ZEXT416((uint)fVar18),ZEXT416((uint)fVar18),9);
  auVar84 = vminss_avx(auVar84,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
  auVar84 = vmaxss_avx(ZEXT816(0) << 0x20,auVar84);
  iVar37 = (int)auVar84._0_4_;
  uVar39 = (ulong)(Disc->primIDs).field_0.i[0];
  lVar9 = *(long *)&pGVar8[2].numPrimitives;
  lVar46 = (long)iVar37 * 0x38;
  lVar10 = *(long *)(lVar9 + 0x10 + lVar46);
  lVar40 = *(long *)(lVar9 + lVar46);
  uVar44 = (ulong)(Disc->primIDs).field_0.i[1];
  uVar47 = (ulong)(Disc->primIDs).field_0.i[2];
  uVar38 = (ulong)(Disc->primIDs).field_0.i[3];
  uVar43 = (ulong)(Disc->primIDs).field_0.i[4];
  auVar63._16_16_ = *(undefined1 (*) [16])(lVar40 + lVar10 * uVar43);
  auVar63._0_16_ = *(undefined1 (*) [16])(lVar40 + lVar10 * uVar39);
  uVar41 = (ulong)(Disc->primIDs).field_0.i[5];
  auVar85._16_16_ = *(undefined1 (*) [16])(lVar40 + lVar10 * uVar41);
  auVar85._0_16_ = *(undefined1 (*) [16])(lVar40 + lVar10 * uVar44);
  uVar45 = (ulong)(Disc->primIDs).field_0.i[6];
  auVar65._16_16_ = *(undefined1 (*) [16])(lVar40 + lVar10 * uVar45);
  auVar65._0_16_ = *(undefined1 (*) [16])(lVar40 + lVar10 * uVar47);
  uVar42 = (ulong)(Disc->primIDs).field_0.i[7];
  auVar66._16_16_ = *(undefined1 (*) [16])(lVar40 + lVar10 * uVar42);
  auVar66._0_16_ = *(undefined1 (*) [16])(lVar40 + lVar10 * uVar38);
  p_Var11 = pGVar8[2].intersectionFilterN;
  lVar10 = *(long *)(p_Var11 + lVar46);
  lVar40 = *(long *)(p_Var11 + lVar46 + 0x10);
  auVar70._16_16_ = *(undefined1 (*) [16])(lVar10 + lVar40 * uVar43);
  auVar70._0_16_ = *(undefined1 (*) [16])(lVar10 + lVar40 * uVar39);
  auVar72._16_16_ = *(undefined1 (*) [16])(lVar10 + lVar40 * uVar41);
  auVar72._0_16_ = *(undefined1 (*) [16])(lVar10 + lVar40 * uVar44);
  auVar78._16_16_ = *(undefined1 (*) [16])(lVar10 + lVar40 * uVar45);
  auVar78._0_16_ = *(undefined1 (*) [16])(lVar10 + lVar40 * uVar47);
  auVar82._16_16_ = *(undefined1 (*) [16])(lVar10 + lVar40 * uVar42);
  auVar82._0_16_ = *(undefined1 (*) [16])(lVar10 + lVar40 * uVar38);
  lVar40 = (long)(iVar37 + 1) * 0x38;
  lVar10 = *(long *)(lVar9 + lVar40);
  lVar9 = *(long *)(lVar9 + 0x10 + lVar40);
  auVar87._16_16_ = *(undefined1 (*) [16])(lVar10 + lVar9 * uVar43);
  auVar87._0_16_ = *(undefined1 (*) [16])(lVar10 + lVar9 * uVar39);
  auVar89._16_16_ = *(undefined1 (*) [16])(lVar10 + lVar9 * uVar41);
  auVar89._0_16_ = *(undefined1 (*) [16])(lVar10 + lVar9 * uVar44);
  auVar91._16_16_ = *(undefined1 (*) [16])(lVar10 + lVar9 * uVar45);
  auVar91._0_16_ = *(undefined1 (*) [16])(lVar10 + lVar9 * uVar47);
  auVar93._16_16_ = *(undefined1 (*) [16])(lVar10 + lVar9 * uVar42);
  auVar93._0_16_ = *(undefined1 (*) [16])(lVar10 + lVar9 * uVar38);
  lVar9 = *(long *)(p_Var11 + lVar40);
  lVar10 = *(long *)(p_Var11 + lVar40 + 0x10);
  auVar49._16_16_ = *(undefined1 (*) [16])(lVar9 + uVar43 * lVar10);
  auVar49._0_16_ = *(undefined1 (*) [16])(lVar9 + uVar39 * lVar10);
  fVar18 = fVar18 - auVar84._0_4_;
  auVar69 = vunpcklps_avx(auVar63,auVar65);
  auVar65 = vunpckhps_avx(auVar63,auVar65);
  auVar63 = vunpcklps_avx(auVar85,auVar66);
  local_300 = vunpckhps_avx(auVar85,auVar66);
  auVar19 = vunpcklps_avx(auVar69,auVar63);
  auVar50 = vunpckhps_avx(auVar69,auVar63);
  auVar20 = vunpcklps_avx(auVar70,auVar78);
  auVar69 = vunpckhps_avx(auVar70,auVar78);
  auVar21 = vunpcklps_avx(auVar72,auVar82);
  auVar63 = vunpckhps_avx(auVar72,auVar82);
  auVar73._16_16_ = *(undefined1 (*) [16])(lVar9 + uVar45 * lVar10);
  auVar73._0_16_ = *(undefined1 (*) [16])(lVar9 + uVar47 * lVar10);
  auVar22 = vunpcklps_avx(auVar69,auVar63);
  auVar60 = vunpcklps_avx(auVar20,auVar21);
  auVar69 = vunpckhps_avx(auVar20,auVar21);
  auVar63 = vunpcklps_avx(auVar87,auVar91);
  local_260 = vunpckhps_avx(auVar87,auVar91);
  auVar20 = vunpcklps_avx(auVar89,auVar93);
  local_240 = vunpckhps_avx(auVar89,auVar93);
  auVar61 = vunpcklps_avx(auVar63,auVar20);
  auVar20 = vunpckhps_avx(auVar63,auVar20);
  auVar23 = vunpcklps_avx(auVar49,auVar73);
  auVar63 = vunpckhps_avx(auVar49,auVar73);
  auVar79._16_16_ = *(undefined1 (*) [16])(lVar9 + uVar41 * lVar10);
  auVar79._0_16_ = *(undefined1 (*) [16])(lVar9 + uVar44 * lVar10);
  auVar74._16_16_ = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar42);
  auVar74._0_16_ = *(undefined1 (*) [16])(lVar9 + uVar38 * lVar10);
  auVar49 = vunpcklps_avx(auVar79,auVar74);
  auVar21 = vunpckhps_avx(auVar79,auVar74);
  auVar21 = vunpcklps_avx(auVar63,auVar21);
  auVar64 = vunpcklps_avx(auVar23,auVar49);
  auVar63 = vunpckhps_avx(auVar23,auVar49);
  fVar1 = 1.0 - fVar18;
  auVar80._4_4_ = fVar1;
  auVar80._0_4_ = fVar1;
  auVar80._8_4_ = fVar1;
  auVar80._12_4_ = fVar1;
  auVar80._16_4_ = fVar1;
  auVar80._20_4_ = fVar1;
  auVar80._24_4_ = fVar1;
  auVar80._28_4_ = fVar1;
  auVar75._0_4_ = fVar18 * auVar61._0_4_;
  auVar75._4_4_ = fVar18 * auVar61._4_4_;
  auVar75._8_4_ = fVar18 * auVar61._8_4_;
  auVar75._12_4_ = fVar18 * auVar61._12_4_;
  auVar75._16_4_ = fVar18 * auVar61._16_4_;
  auVar75._20_4_ = fVar18 * auVar61._20_4_;
  auVar75._24_4_ = fVar18 * auVar61._24_4_;
  auVar75._28_4_ = 0;
  auVar84 = vfmadd231ps_fma(auVar75,auVar80,auVar19);
  auVar23._4_4_ = fVar18 * auVar64._4_4_;
  auVar23._0_4_ = fVar18 * auVar64._0_4_;
  auVar23._8_4_ = fVar18 * auVar64._8_4_;
  auVar23._12_4_ = fVar18 * auVar64._12_4_;
  auVar23._16_4_ = fVar18 * auVar64._16_4_;
  auVar23._20_4_ = fVar18 * auVar64._20_4_;
  auVar23._24_4_ = fVar18 * auVar64._24_4_;
  auVar23._28_4_ = auVar19._28_4_;
  auVar64._0_4_ = fVar18 * auVar63._0_4_;
  auVar64._4_4_ = fVar18 * auVar63._4_4_;
  auVar64._8_4_ = fVar18 * auVar63._8_4_;
  auVar64._12_4_ = fVar18 * auVar63._12_4_;
  auVar64._16_4_ = fVar18 * auVar63._16_4_;
  auVar64._20_4_ = fVar18 * auVar63._20_4_;
  auVar64._24_4_ = fVar18 * auVar63._24_4_;
  auVar64._28_4_ = 0;
  auVar19._4_4_ = fVar18 * auVar21._4_4_;
  auVar19._0_4_ = fVar18 * auVar21._0_4_;
  auVar19._8_4_ = fVar18 * auVar21._8_4_;
  auVar19._12_4_ = fVar18 * auVar21._12_4_;
  auVar19._16_4_ = fVar18 * auVar21._16_4_;
  auVar19._20_4_ = fVar18 * auVar21._20_4_;
  auVar19._24_4_ = fVar18 * auVar21._24_4_;
  auVar19._28_4_ = auVar63._28_4_;
  auVar24 = vfmadd231ps_fma(auVar23,auVar80,auVar60);
  auVar25 = vfmadd231ps_fma(auVar64,auVar80,auVar69);
  auVar26 = vfmadd231ps_fma(auVar19,auVar80,auVar22);
  bVar6 = Disc->numPrimitives;
  local_80[1] = local_80[0];
  local_80[2] = local_80[0];
  local_80[3] = local_80[0];
  uStack_70 = local_80[0];
  uStack_6c = local_80[0];
  uStack_68 = local_80[0];
  uStack_64 = local_80[0];
  fVar1 = *(float *)(ray + k * 4 + 0x40);
  auVar94._4_4_ = fVar1;
  auVar94._0_4_ = fVar1;
  auVar94._8_4_ = fVar1;
  auVar94._12_4_ = fVar1;
  auVar94._16_4_ = fVar1;
  auVar94._20_4_ = fVar1;
  auVar94._24_4_ = fVar1;
  auVar94._28_4_ = fVar1;
  fVar2 = *(float *)(ray + k * 4 + 0x50);
  local_c0._4_4_ = fVar2;
  local_c0._0_4_ = fVar2;
  local_c0._8_4_ = fVar2;
  local_c0._12_4_ = fVar2;
  local_c0._16_4_ = fVar2;
  local_c0._20_4_ = fVar2;
  local_c0._24_4_ = fVar2;
  local_c0._28_4_ = fVar2;
  local_a0 = *(float *)(ray + k * 4 + 0x60);
  fStack_9c = local_a0;
  fStack_98 = local_a0;
  fStack_94 = local_a0;
  fStack_90 = local_a0;
  fStack_8c = local_a0;
  fStack_88 = local_a0;
  fStack_84 = local_a0;
  auVar69._4_4_ = auVar26._4_4_ * local_a0;
  auVar69._0_4_ = auVar26._0_4_ * local_a0;
  auVar69._8_4_ = auVar26._8_4_ * local_a0;
  auVar69._12_4_ = auVar26._12_4_ * local_a0;
  auVar69._16_4_ = local_a0 * 0.0;
  auVar69._20_4_ = local_a0 * 0.0;
  auVar69._24_4_ = local_a0 * 0.0;
  auVar69._28_4_ = local_a0;
  auVar27 = vfmadd231ps_fma(auVar69,local_c0,ZEXT1632(auVar25));
  auVar27 = vfmadd231ps_fma(ZEXT1632(auVar27),auVar94,ZEXT1632(auVar24));
  auVar60._8_4_ = 0x3f800000;
  auVar60._0_8_ = 0x3f8000003f800000;
  auVar60._12_4_ = 0x3f800000;
  auVar60._16_4_ = 0x3f800000;
  auVar60._20_4_ = 0x3f800000;
  auVar60._24_4_ = 0x3f800000;
  auVar60._28_4_ = 0x3f800000;
  auVar63 = vcmpps_avx(ZEXT1632(auVar27),ZEXT832(0) << 0x20,4);
  auVar69 = vblendvps_avx(auVar60,ZEXT1632(auVar27),auVar63);
  auVar21._4_4_ = fVar18 * auVar20._4_4_;
  auVar21._0_4_ = fVar18 * auVar20._0_4_;
  auVar21._8_4_ = fVar18 * auVar20._8_4_;
  auVar21._12_4_ = fVar18 * auVar20._12_4_;
  auVar21._16_4_ = fVar18 * auVar20._16_4_;
  auVar21._20_4_ = fVar18 * auVar20._20_4_;
  auVar21._24_4_ = fVar18 * auVar20._24_4_;
  auVar21._28_4_ = auVar20._28_4_;
  auVar27 = vfmadd231ps_fma(auVar21,auVar80,auVar50);
  auVar50 = vunpcklps_avx(local_260,local_240);
  auVar20._4_4_ = fVar18 * auVar50._4_4_;
  auVar20._0_4_ = fVar18 * auVar50._0_4_;
  auVar20._8_4_ = fVar18 * auVar50._8_4_;
  auVar20._12_4_ = fVar18 * auVar50._12_4_;
  auVar20._16_4_ = fVar18 * auVar50._16_4_;
  auVar20._20_4_ = fVar18 * auVar50._20_4_;
  auVar20._24_4_ = fVar18 * auVar50._24_4_;
  auVar20._28_4_ = local_240._28_4_;
  auVar50 = vunpcklps_avx(auVar65,local_300);
  auVar28 = vfmadd231ps_fma(auVar20,auVar80,auVar50);
  fVar3 = *(float *)(ray + k * 4 + 0x20);
  auVar50._4_4_ = fVar3;
  auVar50._0_4_ = fVar3;
  auVar50._8_4_ = fVar3;
  auVar50._12_4_ = fVar3;
  auVar50._16_4_ = fVar3;
  auVar50._20_4_ = fVar3;
  auVar50._24_4_ = fVar3;
  auVar50._28_4_ = fVar3;
  auVar50 = vsubps_avx(ZEXT1632(auVar28),auVar50);
  auVar22._4_4_ = auVar26._4_4_ * auVar50._4_4_;
  auVar22._0_4_ = auVar26._0_4_ * auVar50._0_4_;
  auVar22._8_4_ = auVar26._8_4_ * auVar50._8_4_;
  auVar22._12_4_ = auVar26._12_4_ * auVar50._12_4_;
  auVar22._16_4_ = auVar50._16_4_ * 0.0;
  auVar22._20_4_ = auVar50._20_4_ * 0.0;
  auVar22._24_4_ = auVar50._24_4_ * 0.0;
  auVar22._28_4_ = auVar61._28_4_;
  fVar4 = *(float *)(ray + k * 4 + 0x10);
  auVar61._4_4_ = fVar4;
  auVar61._0_4_ = fVar4;
  auVar61._8_4_ = fVar4;
  auVar61._12_4_ = fVar4;
  auVar61._16_4_ = fVar4;
  auVar61._20_4_ = fVar4;
  auVar61._24_4_ = fVar4;
  auVar61._28_4_ = fVar4;
  auVar50 = vsubps_avx(ZEXT1632(auVar27),auVar61);
  auVar29 = vfmadd231ps_fma(auVar22,ZEXT1632(auVar25),auVar50);
  fVar5 = *(float *)(ray + k * 4);
  auVar67._4_4_ = fVar5;
  auVar67._0_4_ = fVar5;
  auVar67._8_4_ = fVar5;
  auVar67._12_4_ = fVar5;
  auVar67._16_4_ = fVar5;
  auVar67._20_4_ = fVar5;
  auVar67._24_4_ = fVar5;
  auVar67._28_4_ = fVar5;
  auVar50 = vsubps_avx(ZEXT1632(auVar84),auVar67);
  auVar29 = vfmadd231ps_fma(ZEXT1632(auVar29),ZEXT1632(auVar24),auVar50);
  local_320 = vdivps_avx(ZEXT1632(auVar29),auVar69);
  uVar48 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar71._4_4_ = uVar48;
  auVar71._0_4_ = uVar48;
  auVar71._8_4_ = uVar48;
  auVar71._12_4_ = uVar48;
  auVar71._16_4_ = uVar48;
  auVar71._20_4_ = uVar48;
  auVar71._24_4_ = uVar48;
  auVar71._28_4_ = uVar48;
  auVar69 = vcmpps_avx(auVar71,local_320,2);
  uVar48 = *(undefined4 *)(ray + k * 4 + 0x80);
  local_280._4_4_ = uVar48;
  local_280._0_4_ = uVar48;
  local_280._8_4_ = uVar48;
  local_280._12_4_ = uVar48;
  local_280._16_4_ = uVar48;
  local_280._20_4_ = uVar48;
  local_280._24_4_ = uVar48;
  local_280._28_4_ = uVar48;
  auVar50 = vcmpps_avx(local_320,local_280,2);
  auVar69 = vandps_avx(auVar50,auVar69);
  auVar90._1_3_ = 0;
  auVar90[0] = bVar6;
  auVar90[4] = bVar6;
  auVar90._5_3_ = 0;
  auVar90[8] = bVar6;
  auVar90._9_3_ = 0;
  auVar90[0xc] = bVar6;
  auVar90._13_3_ = 0;
  auVar90[0x10] = bVar6;
  auVar90._17_3_ = 0;
  auVar90[0x14] = bVar6;
  auVar90._21_3_ = 0;
  auVar90[0x18] = bVar6;
  auVar90._25_3_ = 0;
  auVar90[0x1c] = bVar6;
  auVar90._29_3_ = 0;
  auVar50 = vpcmpgtd_avx2(auVar90,_DAT_01fe9900);
  auVar69 = vandps_avx(auVar50,auVar69);
  auVar50 = auVar63 & auVar69;
  if ((((((((auVar50 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar50 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar50 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar50 >> 0x7f,0) != '\0') ||
        (auVar50 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar50 >> 0xbf,0) != '\0') ||
      (auVar50 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar50[0x1f] < '\0') {
    auVar50 = vunpckhps_avx(auVar65,local_300);
    auVar65 = vunpckhps_avx(local_260,local_240);
    auVar31._4_4_ = fVar18 * auVar65._4_4_;
    auVar31._0_4_ = fVar18 * auVar65._0_4_;
    auVar31._8_4_ = fVar18 * auVar65._8_4_;
    auVar31._12_4_ = fVar18 * auVar65._12_4_;
    auVar31._16_4_ = fVar18 * auVar65._16_4_;
    auVar31._20_4_ = fVar18 * auVar65._20_4_;
    auVar31._24_4_ = fVar18 * auVar65._24_4_;
    auVar31._28_4_ = fVar18;
    auVar92 = ZEXT3264(local_320);
    auVar30 = vfmadd231ps_fma(auVar31,auVar80,auVar50);
    auVar69 = vandps_avx(auVar63,auVar69);
    auVar29 = vpackssdw_avx(auVar69._0_16_,auVar69._16_16_);
    fVar18 = local_320._0_4_;
    fVar12 = local_320._4_4_;
    fVar13 = local_320._8_4_;
    fVar14 = local_320._12_4_;
    fVar15 = local_320._16_4_;
    fVar16 = local_320._20_4_;
    fVar17 = local_320._24_4_;
    auVar68._0_4_ = fVar1 * fVar18 + fVar5;
    auVar68._4_4_ = fVar1 * fVar12 + fVar5;
    auVar68._8_4_ = fVar1 * fVar13 + fVar5;
    auVar68._12_4_ = fVar1 * fVar14 + fVar5;
    auVar68._16_4_ = fVar1 * fVar15 + fVar5;
    auVar68._20_4_ = fVar1 * fVar16 + fVar5;
    auVar68._24_4_ = fVar1 * fVar17 + fVar5;
    auVar68._28_4_ = fVar5 + 0.0;
    auVar62._0_4_ = fVar18 * fVar2 + fVar4;
    auVar62._4_4_ = fVar12 * fVar2 + fVar4;
    auVar62._8_4_ = fVar13 * fVar2 + fVar4;
    auVar62._12_4_ = fVar14 * fVar2 + fVar4;
    auVar62._16_4_ = fVar15 * fVar2 + fVar4;
    auVar62._20_4_ = fVar16 * fVar2 + fVar4;
    auVar62._24_4_ = fVar17 * fVar2 + fVar4;
    auVar62._28_4_ = fVar4 + 0.0;
    auVar32._4_4_ = fVar12 * local_a0;
    auVar32._0_4_ = fVar18 * local_a0;
    auVar32._8_4_ = fVar13 * local_a0;
    auVar32._12_4_ = fVar14 * local_a0;
    auVar32._16_4_ = fVar15 * local_a0;
    auVar32._20_4_ = fVar16 * local_a0;
    auVar32._24_4_ = fVar17 * local_a0;
    auVar32._28_4_ = 0;
    auVar51._0_4_ = fVar18 * local_a0 + fVar3;
    auVar51._4_4_ = fVar12 * local_a0 + fVar3;
    auVar51._8_4_ = fVar13 * local_a0 + fVar3;
    auVar51._12_4_ = fVar14 * local_a0 + fVar3;
    auVar51._16_4_ = fVar15 * local_a0 + fVar3;
    auVar51._20_4_ = fVar16 * local_a0 + fVar3;
    auVar51._24_4_ = fVar17 * local_a0 + fVar3;
    auVar51._28_4_ = fVar3 + 0.0;
    auVar69 = vsubps_avx(auVar68,ZEXT1632(auVar84));
    auVar63 = vsubps_avx(auVar62,ZEXT1632(auVar27));
    auVar50 = vsubps_avx(auVar51,ZEXT1632(auVar28));
    auVar33._4_4_ = auVar50._4_4_ * auVar50._4_4_;
    auVar33._0_4_ = auVar50._0_4_ * auVar50._0_4_;
    auVar33._8_4_ = auVar50._8_4_ * auVar50._8_4_;
    auVar33._12_4_ = auVar50._12_4_ * auVar50._12_4_;
    auVar33._16_4_ = auVar50._16_4_ * auVar50._16_4_;
    auVar33._20_4_ = auVar50._20_4_ * auVar50._20_4_;
    auVar33._24_4_ = auVar50._24_4_ * auVar50._24_4_;
    auVar33._28_4_ = auVar50._28_4_;
    auVar84 = vfmadd231ps_fma(auVar33,auVar63,auVar63);
    auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar69,auVar69);
    auVar34._28_4_ = auVar63._28_4_;
    auVar34._0_28_ =
         ZEXT1628(CONCAT412(auVar30._12_4_ * auVar30._12_4_,
                            CONCAT48(auVar30._8_4_ * auVar30._8_4_,
                                     CONCAT44(auVar30._4_4_ * auVar30._4_4_,
                                              auVar30._0_4_ * auVar30._0_4_))));
    auVar69 = vcmpps_avx(ZEXT1632(auVar84),auVar34,1);
    auVar84 = vpackssdw_avx(auVar69._0_16_,auVar69._16_16_);
    auVar84 = vpand_avx(auVar84,auVar29);
    auVar69 = vpmovzxwd_avx2(auVar84);
    auVar69 = vpslld_avx2(auVar69,0x1f);
    if ((((((((auVar69 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar69 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar69 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar69 >> 0x7f,0) != '\0') ||
          (auVar69 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar69 >> 0xbf,0) != '\0') ||
        (auVar69 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar69[0x1f] < '\0')
    {
      local_2a0 = vpsrad_avx2(auVar69,0x1f);
      local_160 = 0;
      uStack_158 = 0;
      uStack_150 = 0;
      uStack_148 = 0;
      local_180 = 0;
      uStack_178 = 0;
      uStack_170 = 0;
      uStack_168 = 0;
      local_140 = local_320;
      local_120 = ZEXT1632(auVar24);
      local_100 = ZEXT1632(auVar25);
      local_e0 = ZEXT1632(auVar26);
      auVar76._8_4_ = 0x7f800000;
      auVar76._0_8_ = 0x7f8000007f800000;
      auVar76._12_4_ = 0x7f800000;
      auVar76._16_4_ = 0x7f800000;
      auVar76._20_4_ = 0x7f800000;
      auVar76._24_4_ = 0x7f800000;
      auVar76._28_4_ = 0x7f800000;
      auVar77 = ZEXT3264(auVar76);
      auVar69 = vblendvps_avx(auVar76,local_320,auVar69);
      auVar63 = vshufps_avx(auVar69,auVar69,0xb1);
      auVar63 = vminps_avx(auVar69,auVar63);
      auVar50 = vshufpd_avx(auVar63,auVar63,5);
      auVar63 = vminps_avx(auVar63,auVar50);
      auVar50 = vpermpd_avx2(auVar63,0x4e);
      auVar63 = vminps_avx(auVar63,auVar50);
      auVar69 = vcmpps_avx(auVar69,auVar63,0);
      auVar24 = vpackssdw_avx(auVar69._0_16_,auVar69._16_16_);
      auVar84 = vpand_avx(auVar24,auVar84);
      auVar69 = vpmovzxwd_avx2(auVar84);
      auVar69 = vpslld_avx2(auVar69,0x1f);
      if ((((((((auVar69 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar69 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar69 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar69 >> 0x7f,0) == '\0') &&
            (auVar69 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar69 >> 0xbf,0) == '\0') &&
          (auVar69 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar69[0x1f])
      {
        auVar69 = local_2a0;
      }
      uVar35 = vmovmskps_avx(auVar69);
      uVar36 = 0;
      for (; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x80000000) {
        uVar36 = uVar36 + 1;
      }
      auVar69 = vpcmpeqd_avx2(auVar32,auVar32);
      auVar81 = ZEXT3264(auVar69);
      auVar83 = ZEXT864(0) << 0x20;
      auVar84 = vpcmpeqd_avx(auVar28,auVar28);
      auVar86 = ZEXT1664(auVar84);
      auVar88 = ZEXT1664(CONCAT88(0x100000001,0x100000001));
      local_2e0 = ray;
      local_2d8 = k;
      do {
        local_2d0.hit = local_210;
        local_2d0.valid = (int *)local_330;
        uVar38 = (ulong)uVar36;
        local_1b0 = local_80[uVar38];
        pGVar8 = (pSVar7->geometries).items[local_1b0].ptr;
        if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
          *(undefined4 *)(local_2a0 + uVar38 * 4) = 0;
        }
        else {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            uVar48 = *(undefined4 *)((long)&local_180 + uVar38 * 4);
            uVar53 = *(undefined4 *)((long)&local_160 + uVar38 * 4);
            *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_140 + uVar38 * 4);
            *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_120 + uVar38 * 4);
            *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_100 + uVar38 * 4);
            *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_e0 + uVar38 * 4);
            *(undefined4 *)(ray + k * 4 + 0xf0) = uVar48;
            *(undefined4 *)(ray + k * 4 + 0x100) = uVar53;
            *(uint *)(ray + k * 4 + 0x110) = (Disc->primIDs).field_0.i[uVar38];
            *(uint *)(ray + k * 4 + 0x120) = local_1b0;
            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
            return;
          }
          local_1e0 = *(undefined4 *)((long)&local_180 + uVar38 * 4);
          local_1d0 = *(undefined4 *)((long)&local_160 + uVar38 * 4);
          local_1c0 = (Disc->primIDs).field_0.i[uVar38];
          uVar48 = *(undefined4 *)(local_120 + uVar38 * 4);
          uVar53 = *(undefined4 *)(local_100 + uVar38 * 4);
          local_200._4_4_ = uVar53;
          local_200._0_4_ = uVar53;
          local_200._8_4_ = uVar53;
          local_200._12_4_ = uVar53;
          uVar53 = *(undefined4 *)(local_e0 + uVar38 * 4);
          local_1f0._4_4_ = uVar53;
          local_1f0._0_4_ = uVar53;
          local_1f0._8_4_ = uVar53;
          local_1f0._12_4_ = uVar53;
          local_210[0] = (RTCHitN)(char)uVar48;
          local_210[1] = (RTCHitN)(char)((uint)uVar48 >> 8);
          local_210[2] = (RTCHitN)(char)((uint)uVar48 >> 0x10);
          local_210[3] = (RTCHitN)(char)((uint)uVar48 >> 0x18);
          local_210[4] = (RTCHitN)(char)uVar48;
          local_210[5] = (RTCHitN)(char)((uint)uVar48 >> 8);
          local_210[6] = (RTCHitN)(char)((uint)uVar48 >> 0x10);
          local_210[7] = (RTCHitN)(char)((uint)uVar48 >> 0x18);
          local_210[8] = (RTCHitN)(char)uVar48;
          local_210[9] = (RTCHitN)(char)((uint)uVar48 >> 8);
          local_210[10] = (RTCHitN)(char)((uint)uVar48 >> 0x10);
          local_210[0xb] = (RTCHitN)(char)((uint)uVar48 >> 0x18);
          local_210[0xc] = (RTCHitN)(char)uVar48;
          local_210[0xd] = (RTCHitN)(char)((uint)uVar48 >> 8);
          local_210[0xe] = (RTCHitN)(char)((uint)uVar48 >> 0x10);
          local_210[0xf] = (RTCHitN)(char)((uint)uVar48 >> 0x18);
          uStack_1dc = local_1e0;
          uStack_1d8 = local_1e0;
          uStack_1d4 = local_1e0;
          uStack_1cc = local_1d0;
          uStack_1c8 = local_1d0;
          uStack_1c4 = local_1d0;
          uStack_1bc = local_1c0;
          uStack_1b8 = local_1c0;
          uStack_1b4 = local_1c0;
          uStack_1ac = local_1b0;
          uStack_1a8 = local_1b0;
          uStack_1a4 = local_1b0;
          uStack_19c = context->user->instID[0];
          local_1a0 = uStack_19c;
          uStack_198 = uStack_19c;
          uStack_194 = uStack_19c;
          uStack_190 = context->user->instPrimID[0];
          uStack_18c = uStack_190;
          uStack_188 = uStack_190;
          uStack_184 = uStack_190;
          *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_140 + uVar38 * 4);
          local_330 = *(undefined1 (*) [16])
                       (mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
          local_2d0.geometryUserPtr = pGVar8->userPtr;
          local_2d0.context = context->user;
          local_2d0.N = 4;
          local_300._0_16_ = auVar88._0_16_;
          local_2d0.ray = (RTCRayN *)ray;
          if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
            local_260._0_8_ = Disc;
            auVar69 = ZEXT1632(auVar81._0_16_);
            auVar84 = auVar86._0_16_;
            (*pGVar8->intersectionFilterN)(&local_2d0);
            auVar88 = ZEXT1664(local_300._0_16_);
            auVar84 = vpcmpeqd_avx(auVar84,auVar84);
            auVar86 = ZEXT1664(auVar84);
            auVar83 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar69 = vpcmpeqd_avx2(auVar69,auVar69);
            auVar81 = ZEXT3264(auVar69);
            auVar77 = ZEXT3264(CONCAT428(0x7f800000,
                                         CONCAT424(0x7f800000,
                                                   CONCAT420(0x7f800000,
                                                             CONCAT416(0x7f800000,
                                                                       CONCAT412(0x7f800000,
                                                                                 CONCAT48(0x7f800000
                                                                                          ,
                                                  0x7f8000007f800000)))))));
            auVar92 = ZEXT3264(local_320);
            Disc = (Primitive *)local_260._0_8_;
          }
          auVar84 = auVar86._0_16_;
          if (local_330 == (undefined1  [16])0x0) {
            auVar24 = vpcmpeqd_avx(auVar83._0_16_,(undefined1  [16])0x0);
            auVar84 = auVar84 ^ auVar24;
          }
          else {
            p_Var11 = context->args->filter;
            if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
              auVar69 = ZEXT1632(auVar81._0_16_);
              (*p_Var11)(&local_2d0);
              auVar88 = ZEXT1664(local_300._0_16_);
              auVar84 = vpcmpeqd_avx(auVar84,auVar84);
              auVar86 = ZEXT1664(auVar84);
              auVar83 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar69 = vpcmpeqd_avx2(auVar69,auVar69);
              auVar81 = ZEXT3264(auVar69);
              auVar77 = ZEXT3264(CONCAT428(0x7f800000,
                                           CONCAT424(0x7f800000,
                                                     CONCAT420(0x7f800000,
                                                               CONCAT416(0x7f800000,
                                                                         CONCAT412(0x7f800000,
                                                                                   CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
              auVar92 = ZEXT3264(local_320);
            }
            auVar24 = vpcmpeqd_avx(auVar83._0_16_,local_330);
            auVar84 = auVar86._0_16_ ^ auVar24;
            if (local_330 != (undefined1  [16])0x0) {
              auVar24 = auVar86._0_16_ ^ auVar24;
              auVar25 = vmaskmovps_avx(auVar24,*(undefined1 (*) [16])local_2d0.hit);
              *(undefined1 (*) [16])(local_2d0.ray + 0xc0) = auVar25;
              auVar25 = vmaskmovps_avx(auVar24,*(undefined1 (*) [16])(local_2d0.hit + 0x10));
              *(undefined1 (*) [16])(local_2d0.ray + 0xd0) = auVar25;
              auVar25 = vmaskmovps_avx(auVar24,*(undefined1 (*) [16])(local_2d0.hit + 0x20));
              *(undefined1 (*) [16])(local_2d0.ray + 0xe0) = auVar25;
              auVar25 = vmaskmovps_avx(auVar24,*(undefined1 (*) [16])(local_2d0.hit + 0x30));
              *(undefined1 (*) [16])(local_2d0.ray + 0xf0) = auVar25;
              auVar25 = vmaskmovps_avx(auVar24,*(undefined1 (*) [16])(local_2d0.hit + 0x40));
              *(undefined1 (*) [16])(local_2d0.ray + 0x100) = auVar25;
              auVar25 = vmaskmovps_avx(auVar24,*(undefined1 (*) [16])(local_2d0.hit + 0x50));
              *(undefined1 (*) [16])(local_2d0.ray + 0x110) = auVar25;
              auVar25 = vmaskmovps_avx(auVar24,*(undefined1 (*) [16])(local_2d0.hit + 0x60));
              *(undefined1 (*) [16])(local_2d0.ray + 0x120) = auVar25;
              auVar25 = vmaskmovps_avx(auVar24,*(undefined1 (*) [16])(local_2d0.hit + 0x70));
              *(undefined1 (*) [16])(local_2d0.ray + 0x130) = auVar25;
              auVar24 = vmaskmovps_avx(auVar24,*(undefined1 (*) [16])(local_2d0.hit + 0x80));
              *(undefined1 (*) [16])(local_2d0.ray + 0x140) = auVar24;
            }
          }
          if ((auVar88._0_16_ & auVar84) == (undefined1  [16])0x0) {
            *(undefined4 *)(ray + k * 4 + 0x80) = local_280._0_4_;
            uVar48 = local_280._0_4_;
            uVar53 = local_280._4_4_;
            uVar54 = local_280._8_4_;
            uVar55 = local_280._12_4_;
            uVar56 = local_280._16_4_;
            uVar57 = local_280._20_4_;
            uVar58 = local_280._24_4_;
            uVar59 = local_280._28_4_;
          }
          else {
            uVar48 = *(undefined4 *)(ray + k * 4 + 0x80);
            uVar53 = 0;
            uVar54 = 0;
            uVar55 = 0;
            uVar56 = 0;
            uVar57 = 0;
            uVar58 = 0;
            uVar59 = 0;
          }
          *(undefined4 *)(local_2a0 + uVar38 * 4) = 0;
          local_280._4_4_ = uVar53;
          local_280._0_4_ = uVar48;
          local_280._8_4_ = uVar54;
          local_280._12_4_ = uVar55;
          local_280._16_4_ = uVar56;
          local_280._20_4_ = uVar57;
          local_280._24_4_ = uVar58;
          local_280._28_4_ = uVar59;
          auVar52._4_4_ = uVar48;
          auVar52._0_4_ = uVar48;
          auVar52._8_4_ = uVar48;
          auVar52._12_4_ = uVar48;
          auVar52._16_4_ = uVar48;
          auVar52._20_4_ = uVar48;
          auVar52._24_4_ = uVar48;
          auVar52._28_4_ = uVar48;
          auVar69 = vcmpps_avx(auVar92._0_32_,auVar52,2);
          local_2a0 = vandps_avx(auVar69,local_2a0);
        }
        if ((((((((local_2a0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_2a0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_2a0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_2a0 >> 0x7f,0) == '\0') &&
              (local_2a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_2a0 >> 0xbf,0) == '\0') &&
            (local_2a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_2a0[0x1f]) {
          return;
        }
        auVar69 = vblendvps_avx(auVar77._0_32_,auVar92._0_32_,local_2a0);
        auVar63 = vshufps_avx(auVar69,auVar69,0xb1);
        auVar63 = vminps_avx(auVar69,auVar63);
        auVar50 = vshufpd_avx(auVar63,auVar63,5);
        auVar63 = vminps_avx(auVar63,auVar50);
        auVar50 = vpermpd_avx2(auVar63,0x4e);
        auVar63 = vminps_avx(auVar63,auVar50);
        auVar63 = vcmpps_avx(auVar69,auVar63,0);
        auVar50 = local_2a0 & auVar63;
        auVar69 = local_2a0;
        if ((((((((auVar50 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar50 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar50 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar50 >> 0x7f,0) != '\0') ||
              (auVar50 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar50 >> 0xbf,0) != '\0') ||
            (auVar50 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar50[0x1f] < '\0') {
          auVar69 = vandps_avx(auVar63,local_2a0);
        }
        uVar35 = vmovmskps_avx(auVar69);
        uVar36 = 0;
        for (; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x80000000) {
          uVar36 = uVar36 + 1;
        }
      } while( true );
    }
  }
  return;
}

Assistant:

static __forceinline void intersect(
          const Precalculations& pre, RayHitK<K>& ray, size_t k, RayQueryContext* context, const Primitive& Disc)
      {
        STAT3(normal.trav_prims, 1, 1, 1);
        const Points* geom = context->scene->get<Points>(Disc.geomID());
        Vec4vf<M> v0; Vec3vf<M> n0;
        Disc.gather(v0, n0, geom, ray.time()[k]);
        const vbool<M> valid = Disc.valid();
        DiscIntersectorK<M, K>::intersect(
            valid, ray, k, context, geom, pre, v0, n0,
            Intersect1KEpilogM<M, K, filter>(ray, k, context, Disc.geomID(), Disc.primID()));
      }